

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void printNode<cpprofiler::Node&>(Node *node,ostream *os)

{
  ostream *poVar1;
  NodeUID local_38;
  NodeUID local_28;
  
  local_28.nid = (node->node_).nid;
  local_28.rid = (node->node_).rid;
  local_28.tid = (node->node_).tid;
  poVar1 = operator<<(os,&local_28);
  poVar1 = std::operator<<(poVar1,", parent: ");
  local_38.nid = (node->parent_).nid;
  local_38.rid = (node->parent_).rid;
  local_38.tid = (node->parent_).tid;
  poVar1 = operator<<(poVar1,&local_38);
  poVar1 = std::operator<<(poVar1,", alt: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,node->alt_);
  poVar1 = std::operator<<(poVar1,", kids: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,node->kids_);
  poVar1 = std::operator<<(poVar1,", status: ");
  std::ostream::operator<<((ostream *)poVar1,node->status_);
  if ((node->label_).present == true) {
    poVar1 = std::operator<<(os,", label: ");
    std::operator<<(poVar1,(string *)&node->label_);
  }
  if ((node->nogood_).present == true) {
    poVar1 = std::operator<<(os,", nogood: ");
    std::operator<<(poVar1,(string *)&node->nogood_);
  }
  if ((node->info_).present == true) {
    poVar1 = std::operator<<(os,", info: ");
    std::operator<<(poVar1,(string *)&node->info_);
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

static void printNode(T&& node, std::ostream& os) {
	os << node.nodeUID() << ", parent: " << node.parentUID() << ", alt: " << node.alt()
		 << ", kids: " << node.kids() << ", status: " << node.status();
	if (node.label().valid()) {
		os << ", label: " << node.label().value();
	}
	if (node.nogood().valid()) {
		os << ", nogood: " << node.nogood().value();
	}
	if (node.info().valid()) {
		os << ", info: " << node.info().value();
	}
	os << "\n";
}